

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O2

bool __thiscall Imf_3_4::ChannelList::operator==(ChannelList *this,ChannelList *other)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  
  p_Var2 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &(other->_map)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (other->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var2 != p_Var5 && ((_Rb_tree_header *)p_Var3 != p_Var4));
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar1 = Channel::operator==((Channel *)(p_Var2 + 9),(Channel *)(p_Var3 + 9));
    if (!bVar1) {
      return false;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return (_Rb_tree_header *)p_Var3 == p_Var4 && (_Rb_tree_header *)p_Var2 == p_Var5;
}

Assistant:

bool
ChannelList::operator== (const ChannelList& other) const
{
    ConstIterator i = begin ();
    ConstIterator j = other.begin ();

    while (i != end () && j != other.end ())
    {
        if (!(i.channel () == j.channel ())) return false;

        ++i;
        ++j;
    }

    return i == end () && j == other.end ();
}